

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void compress_block(deflate_state *s,ct_data *ltree,ct_data *dtree)

{
  byte bVar1;
  Bytef BVar2;
  ushort uVar3;
  uchf *puVar4;
  ulg uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  
  if (s->sym_next != 0) {
    uVar7 = 0;
    do {
      puVar4 = s->sym_buf;
      uVar14 = (uint)CONCAT11(puVar4[uVar7 + 1],puVar4[uVar7]);
      bVar1 = puVar4[uVar7 + 2];
      if (uVar14 == 0) {
        uVar10 = ltree[bVar1].dl.dad;
        iVar8 = s->bi_valid;
        uVar3 = ltree[bVar1].fc.freq;
        uVar9 = uVar3 << ((byte)iVar8 & 0x1f);
        if ((int)(0x10 - (uint)uVar10) < iVar8) {
          uVar9 = uVar9 | s->bi_buf;
          s->bi_buf = uVar9;
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = (Bytef)uVar9;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = BVar2;
          s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar8 = (uint)uVar10 + s->bi_valid + -0x10;
        }
        else {
          s->bi_buf = s->bi_buf | uVar9;
          iVar8 = iVar8 + (uint)uVar10;
        }
        s->bi_valid = iVar8;
      }
      else {
        uVar13 = (ulong)""[bVar1];
        uVar10 = ltree[uVar13 + 0x101].dl.dad;
        iVar8 = s->bi_valid;
        uVar3 = ltree[uVar13 + 0x101].fc.freq;
        uVar9 = uVar3 << ((byte)iVar8 & 0x1f);
        if ((int)(0x10 - (uint)uVar10) < iVar8) {
          uVar9 = uVar9 | s->bi_buf;
          s->bi_buf = uVar9;
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = (Bytef)uVar9;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = BVar2;
          s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar8 = s->bi_valid + (uint)uVar10 + -0x10;
        }
        else {
          s->bi_buf = s->bi_buf | uVar9;
          iVar8 = iVar8 + (uint)uVar10;
        }
        s->bi_valid = iVar8;
        if (0xffffffffffffffeb < uVar13 - 0x1c) {
          uVar11 = (uint)bVar1 - base_length[uVar13];
          iVar12 = extra_lbits[uVar13];
          if (0x10 - iVar12 < iVar8) {
            uVar10 = (ushort)(uVar11 << ((byte)iVar8 & 0x1f)) | s->bi_buf;
            s->bi_buf = uVar10;
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = (Bytef)uVar10;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = BVar2;
            s->bi_buf = (ush)((uVar11 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar12 = iVar12 + s->bi_valid + -0x10;
          }
          else {
            s->bi_buf = s->bi_buf | (ushort)(uVar11 << ((byte)iVar8 & 0x1f));
            iVar12 = iVar12 + iVar8;
          }
          s->bi_valid = iVar12;
        }
        uVar11 = uVar14 - 1;
        uVar6 = (uVar11 >> 7) + 0x100;
        if (uVar14 < 0x101) {
          uVar6 = uVar11;
        }
        bVar1 = ""[uVar6];
        uVar10 = dtree[bVar1].dl.dad;
        iVar8 = s->bi_valid;
        uVar3 = dtree[bVar1].fc.freq;
        uVar9 = uVar3 << ((byte)iVar8 & 0x1f);
        if ((int)(0x10 - (uint)uVar10) < iVar8) {
          uVar9 = uVar9 | s->bi_buf;
          s->bi_buf = uVar9;
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = (Bytef)uVar9;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = BVar2;
          s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar8 = (uint)uVar10 + s->bi_valid + -0x10;
        }
        else {
          s->bi_buf = s->bi_buf | uVar9;
          iVar8 = iVar8 + (uint)uVar10;
        }
        s->bi_valid = iVar8;
        if (3 < bVar1) {
          uVar11 = uVar11 - base_dist[bVar1];
          iVar12 = extra_dbits[bVar1];
          if (0x10 - iVar12 < iVar8) {
            uVar10 = (ushort)(uVar11 << ((byte)iVar8 & 0x1f)) | s->bi_buf;
            s->bi_buf = uVar10;
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = (Bytef)uVar10;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = BVar2;
            s->bi_buf = (ush)((uVar11 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar12 = iVar12 + s->bi_valid + -0x10;
          }
          else {
            s->bi_buf = s->bi_buf | (ushort)(uVar11 << ((byte)iVar8 & 0x1f));
            iVar12 = iVar12 + iVar8;
          }
          s->bi_valid = iVar12;
        }
      }
      uVar7 = uVar7 + 3;
    } while (uVar7 < s->sym_next);
  }
  uVar10 = ltree[0x100].dl.dad;
  iVar8 = s->bi_valid;
  uVar3 = ltree[0x100].fc.freq;
  uVar9 = uVar3 << ((byte)iVar8 & 0x1f) | s->bi_buf;
  s->bi_buf = uVar9;
  if ((int)(0x10 - (uint)uVar10) < iVar8) {
    uVar5 = s->pending;
    s->pending = uVar5 + 1;
    s->pending_buf[uVar5] = (Bytef)uVar9;
    BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar5 = s->pending;
    s->pending = uVar5 + 1;
    s->pending_buf[uVar5] = BVar2;
    s->bi_buf = uVar3 >> (0x10U - (char)s->bi_valid & 0x1f);
    iVar8 = (uint)uVar10 + s->bi_valid + -0x10;
  }
  else {
    iVar8 = iVar8 + (uint)uVar10;
  }
  s->bi_valid = iVar8;
  return;
}

Assistant:

local void compress_block(deflate_state *s, const ct_data *ltree,
                          const ct_data *dtree) {
    unsigned dist;      /* distance of matched string */
    int lc;             /* match length or unmatched char (if dist == 0) */
    unsigned sx = 0;    /* running index in symbol buffers */
    unsigned code;      /* the code to send */
    int extra;          /* number of extra bits to send */

    if (s->sym_next != 0) do {
#ifdef LIT_MEM
        dist = s->d_buf[sx];
        lc = s->l_buf[sx++];
#else
        dist = s->sym_buf[sx++] & 0xff;
        dist += (unsigned)(s->sym_buf[sx++] & 0xff) << 8;
        lc = s->sym_buf[sx++];
#endif
        if (dist == 0) {
            send_code(s, lc, ltree); /* send a literal byte */
            Tracecv(isgraph(lc), (stderr," '%c' ", lc));
        } else {
            /* Here, lc is the match length - MIN_MATCH */
            code = _length_code[lc];
            send_code(s, code + LITERALS + 1, ltree);   /* send length code */
            extra = extra_lbits[code];
            if (extra != 0) {
                lc -= base_length[code];
                send_bits(s, lc, extra);       /* send the extra length bits */
            }
            dist--; /* dist is now the match distance - 1 */
            code = d_code(dist);
            Assert (code < D_CODES, "bad d_code");

            send_code(s, code, dtree);       /* send the distance code */
            extra = extra_dbits[code];
            if (extra != 0) {
                dist -= (unsigned)base_dist[code];
                send_bits(s, dist, extra);   /* send the extra distance bits */
            }
        } /* literal or match pair ? */

        /* Check for no overlay of pending_buf on needed symbols */
#ifdef LIT_MEM
        Assert(s->pending < 2 * (s->lit_bufsize + sx), "pendingBuf overflow");
#else
        Assert(s->pending < s->lit_bufsize + sx, "pendingBuf overflow");
#endif

    } while (sx < s->sym_next);

    send_code(s, END_BLOCK, ltree);
}